

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_codestream_info_v2_t * j2k_get_cstr_info(opj_j2k_v2_t *p_j2k)

{
  undefined4 uVar1;
  OPJ_UINT32 *pOVar2;
  opj_codestream_info_v2_t *poVar3;
  opj_tccp_info_t *poVar4;
  OPJ_UINT32 *pOVar5;
  long in_RDI;
  OPJ_INT32 numbands;
  OPJ_INT32 bandno;
  opj_tccp_info_t *l_tccp_info;
  opj_tccp_t *l_tccp;
  opj_codestream_info_v2_t *cstr_info;
  opj_tcp_v2_t *l_default_tile;
  OPJ_UINT16 numcomps;
  OPJ_UINT16 compno;
  int local_3c;
  int local_34;
  ushort local_a;
  
  uVar1 = *(undefined4 *)(*(long *)(in_RDI + 0x60) + 0x10);
  poVar3 = (opj_codestream_info_v2_t *)calloc(1,0x48);
  poVar3->nbcomps = *(OPJ_UINT32 *)(*(long *)(in_RDI + 0x60) + 0x10);
  poVar3->tx0 = *(OPJ_UINT32 *)(in_RDI + 0x74);
  poVar3->ty0 = *(OPJ_UINT32 *)(in_RDI + 0x78);
  poVar3->tdx = *(OPJ_UINT32 *)(in_RDI + 0x7c);
  poVar3->tdy = *(OPJ_UINT32 *)(in_RDI + 0x80);
  poVar3->tw = *(OPJ_UINT32 *)(in_RDI + 0x90);
  poVar3->th = *(OPJ_UINT32 *)(in_RDI + 0x94);
  poVar3->tile_info = (opj_tile_info_v2_t *)0x0;
  pOVar2 = *(OPJ_UINT32 **)(in_RDI + 0x10);
  (poVar3->m_default_tile_info).csty = *pOVar2;
  (poVar3->m_default_tile_info).prg = pOVar2[1];
  (poVar3->m_default_tile_info).numlayers = pOVar2[2];
  (poVar3->m_default_tile_info).mct = pOVar2[4];
  poVar4 = (opj_tccp_info_t *)calloc((ulong)poVar3->nbcomps,0x438);
  (poVar3->m_default_tile_info).tccp_info = poVar4;
  for (local_a = 0; local_a < (ushort)uVar1; local_a = local_a + 1) {
    pOVar5 = (OPJ_UINT32 *)(*(long *)(pOVar2 + 0x574) + (ulong)local_a * 0x438);
    poVar4 = (poVar3->m_default_tile_info).tccp_info;
    poVar4[local_a].csty = *pOVar5;
    poVar4[local_a].numresolutions = pOVar5[1];
    poVar4[local_a].cblkw = pOVar5[2];
    poVar4[local_a].cblkh = pOVar5[3];
    poVar4[local_a].cblksty = pOVar5[4];
    poVar4[local_a].qmfbid = pOVar5[5];
    if (pOVar5[1] < 0x21) {
      memcpy(poVar4[local_a].prch,pOVar5 + 0xec,(ulong)pOVar5[1]);
      memcpy(poVar4[local_a].prcw,pOVar5 + 0xcb,(ulong)pOVar5[1]);
    }
    poVar4[local_a].qntsty = pOVar5[6];
    poVar4[local_a].numgbits = pOVar5[0xc9];
    if (pOVar5[6] == 1) {
      local_3c = 1;
    }
    else {
      local_3c = pOVar5[1] * 3 + -2;
    }
    if (local_3c < 0x61) {
      for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
        poVar4[local_a].stepsizes_mant[local_34] = pOVar5[(long)local_34 * 2 + 8];
        poVar4[local_a].stepsizes_expn[local_34] = pOVar5[(long)local_34 * 2 + 7];
      }
    }
    poVar4[local_a].roishift = pOVar5[0xca];
  }
  return poVar3;
}

Assistant:

opj_codestream_info_v2_t* j2k_get_cstr_info(opj_j2k_v2_t* p_j2k)
{
	OPJ_UINT16 compno;
	OPJ_UINT16 numcomps = p_j2k->m_private_image->numcomps;
	opj_tcp_v2_t *l_default_tile;
	opj_codestream_info_v2_t* cstr_info = (opj_codestream_info_v2_t*) opj_calloc(1,sizeof(opj_codestream_info_v2_t));

	cstr_info->nbcomps = p_j2k->m_private_image->numcomps;

	cstr_info->tx0 = p_j2k->m_cp.tx0;
	cstr_info->ty0 = p_j2k->m_cp.ty0;
	cstr_info->tdx = p_j2k->m_cp.tdx;
	cstr_info->tdy = p_j2k->m_cp.tdy;
	cstr_info->tw = p_j2k->m_cp.tw;
	cstr_info->th = p_j2k->m_cp.th;

	cstr_info->tile_info = NULL; /* Not fill from the main header*/

	l_default_tile = p_j2k->m_specific_param.m_decoder.m_default_tcp;

	cstr_info->m_default_tile_info.csty = l_default_tile->csty;
	cstr_info->m_default_tile_info.prg = l_default_tile->prg;
	cstr_info->m_default_tile_info.numlayers = l_default_tile->numlayers;
	cstr_info->m_default_tile_info.mct = l_default_tile->mct;

	cstr_info->m_default_tile_info.tccp_info = (opj_tccp_info_t*) opj_calloc(cstr_info->nbcomps, sizeof(opj_tccp_info_t));

	for (compno = 0; compno < numcomps; compno++) {
		opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
		opj_tccp_info_t *l_tccp_info = &(cstr_info->m_default_tile_info.tccp_info[compno]);
		OPJ_INT32 bandno, numbands;

		/* coding style*/
		l_tccp_info->csty = l_tccp->csty;
		l_tccp_info->numresolutions = l_tccp->numresolutions;
		l_tccp_info->cblkw = l_tccp->cblkw;
		l_tccp_info->cblkh = l_tccp->cblkh;
		l_tccp_info->cblksty = l_tccp->cblksty;
		l_tccp_info->qmfbid = l_tccp->qmfbid;
		if (l_tccp->numresolutions < J2K_MAXRLVLS)
		{
			memcpy(l_tccp_info->prch, l_tccp->prch, l_tccp->numresolutions);
			memcpy(l_tccp_info->prcw, l_tccp->prcw, l_tccp->numresolutions);
		}

		/* quantization style*/
		l_tccp_info->qntsty = l_tccp->qntsty;
		l_tccp_info->numgbits = l_tccp->numgbits;

		numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 : l_tccp->numresolutions * 3 - 2;
		if (numbands < J2K_MAXBANDS) {
			for (bandno = 0; bandno < numbands; bandno++) {
				l_tccp_info->stepsizes_mant[bandno] = l_tccp->stepsizes[bandno].mant;
				l_tccp_info->stepsizes_expn[bandno] = l_tccp->stepsizes[bandno].expn;
			}
		}

		/* RGN value*/
		l_tccp_info->roishift = l_tccp->roishift;
	}


	return cstr_info;
}